

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O0

int dbon(void)

{
  schar sVar1;
  int local_14;
  int bonus;
  int str;
  
  sVar1 = acurr(0);
  if (u.umonnum == u.umonster) {
    if (sVar1 < '\x06') {
      local_14 = -1;
    }
    else if (sVar1 < '\x10') {
      local_14 = 0;
    }
    else if (sVar1 < '\x12') {
      local_14 = 1;
    }
    else if (sVar1 == '\x12') {
      local_14 = 2;
    }
    else if (sVar1 < '^') {
      local_14 = 3;
    }
    else if (sVar1 < 'm') {
      local_14 = 4;
    }
    else if (sVar1 < 'v') {
      local_14 = 5;
    }
    else if (sVar1 == 'v') {
      local_14 = 6;
    }
    else {
      local_14 = 7;
    }
    if ((uwep != (obj *)0x0) &&
       (((uwep->oclass == '\x02' || (uwep->oclass == '\x06')) &&
        ((*(ushort *)&objects[uwep->otyp].field_0x11 & 1) != 0)))) {
      local_14 = local_14 << 1;
    }
    bonus = local_14;
  }
  else {
    bonus = 0;
  }
  return bonus;
}

Assistant:

int dbon(void)
{
	int str = ACURR(A_STR);
	int bonus = 0;

	if (Upolyd) return 0;

	if (str < 6) bonus = -1;
	else if (str < 16) bonus = 0;
	else if (str < 18) bonus = 1;
	else if (str == 18) bonus = 2;		/* up to 18 */
	else if (str <= STR18(75)) bonus = 3;	/* up to 18/75 */
	else if (str <= STR18(90)) bonus = 4;	/* up to 18/90 */
	else if (str < STR18(100)) bonus = 5;	/* up to 18/99 */
	else if (str == STR18(100)) bonus = 6;	/* 18/ ** only */
	else bonus = 7;		/* Gauntlets of Power or 18/ ** exceeded */

	/* HASAAAAAN CHOP!
	 *
	 * If you're wielding a two-handed weapon, let's just, hmm,
	 * double this bonus.  Yes, even when negative; those are HEAVY.
	 *
	 * This should sharply increase the appeal of two-handers
	 * compared to #twoweapon.
	 */
	if (uwep && bimanual(uwep)) bonus *= 2;

	return bonus;
}